

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O2

int nonblankrange(char *str,int start,int len)

{
  char cVar1;
  ulong uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)start;
  if (start < 1) {
    uVar4 = uVar2;
  }
  for (; (int)uVar4 != (int)uVar2; uVar2 = uVar2 + 1) {
    if (str[uVar2] == '\0') {
      return 0;
    }
  }
  if (len < 1) {
    len = 0;
  }
  lVar5 = 0;
  while( true ) {
    if (len == (int)lVar5) {
      return 0;
    }
    cVar1 = str[lVar5 + uVar4];
    if ((long)cVar1 == 0) break;
    ppuVar3 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      return 1;
    }
    lVar5 = lVar5 + 1;
  }
  return 0;
}

Assistant:

int nonblankrange(char *str, int start, int len) {
   register int i;

   for(i = 0; i < start; i++) {
      if (*str++ == '\0')   { return 0; }
   }
   for(i = 0; i < len; i++) {
      if (*str == '\0')     { break; }
      if (! isspace(*str))  { return 1; }
      str++;
   }
   return 0;
}